

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

Gia_Man_t * Dam_ManMultiAig(Dam_Man_t *pMan)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p;
  uint uVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  uint *puVar9;
  Vec_Int_t *pVVar10;
  int *__s;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  
  pGVar12 = pMan->pGia;
  p_00 = Gia_ManStart(pGVar12->nObjs * 2);
  pcVar2 = pGVar12->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = pGVar12->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  iVar1 = p_00->nObjsAlloc;
  puVar9 = (uint *)calloc((long)iVar1,4);
  p_00->pMuxes = puVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar13 = iVar1;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar13;
  if (iVar13 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar13 << 2);
  }
  pVVar10->pArray = __s;
  pVVar10->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  p_00->vLevels = pVVar10;
  Gia_ManFillValue(pGVar12);
  pGVar12->pObjs->Value = 0;
  pVVar10 = pGVar12->vCis;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar14];
      if (((long)iVar1 < 0) || (pGVar12->nObjs <= iVar1)) goto LAB_00651652;
      pGVar3 = pGVar12->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar18 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) {
LAB_00651633:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_00651633;
      pGVar3 = pGVar3 + iVar1;
      uVar18 = ((long)pGVar11 - (long)pGVar4 >> 2) * -0x5555555555555555;
      uVar17 = (uint)uVar18;
      uVar6 = uVar17 * 2;
      pGVar3->Value = uVar6;
      if ((int)uVar6 < 0) goto LAB_00651690;
      pGVar4 = pGVar12->pObjs;
      if ((pGVar3 < pGVar4) || (pGVar4 + pGVar12->nObjs <= pGVar3)) goto LAB_00651633;
      pVVar10 = p_00->vLevels;
      uVar15 = ((long)pGVar3 - (long)pGVar4 >> 2) * -0x5555555555555555;
      p = pGVar12->vLevels;
      iVar1 = (int)uVar15;
      Vec_IntFillExtra(p,iVar1 + 1,0);
      if ((iVar1 < 0) || (p->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar10->nSize <= (int)(uVar17 & 0x7fffffff)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar10->pArray[uVar18 & 0x7fffffff] = p->pArray[uVar15 & 0x7fffffff];
      lVar14 = lVar14 + 1;
      pVVar10 = pGVar12->vCis;
    } while (lVar14 < pVVar10->nSize);
  }
  Gia_ManHashStart(p_00);
  uVar6 = 0;
  if (pGVar12->nBufs == 0) {
    uVar6 = pGVar12->nObjs;
  }
  if ((int)uVar6 < pGVar12->nObjs) {
    lVar14 = (ulong)uVar6 * 0xc;
    uVar17 = uVar6;
    do {
      if ((int)uVar6 < 0) goto LAB_00651652;
      pGVar3 = pGVar12->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar5 = (uint)*(undefined8 *)(&pGVar3->field_0x0 + lVar14);
      if (((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar5 & 0x1fffffff) ==
          ((uint)((ulong)*(undefined8 *)(&pGVar3->field_0x0 + lVar14) >> 0x20) & 0x1fffffff))) {
        Dam_ManMultiAig_rec(pMan,p_00,pGVar12,
                            (Gia_Obj_t *)
                            ((long)pGVar3 + (ulong)((uVar5 & 0x1fffffff) << 2) * -3 + lVar14));
        uVar16 = (uint)*(undefined8 *)(&pGVar3->field_0x0 + lVar14);
        uVar5 = *(uint *)((long)pGVar3 + (ulong)((uVar16 & 0x1fffffff) << 2) * -3 + lVar14 + 8);
        if ((int)uVar5 < 0) goto LAB_006516af;
        uVar5 = Gia_ManAppendBuf(p_00,uVar16 >> 0x1d & 1 ^ uVar5);
        *(uint *)((long)&pGVar3->Value + lVar14) = uVar5;
        if ((int)uVar5 < 0) {
LAB_00651690:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (p_00->nObjs <= (int)(uVar5 >> 1)) goto LAB_00651652;
        Gia_ObjSetGateLevel(p_00,p_00->pObjs + (uVar5 >> 1));
      }
      lVar14 = lVar14 + 0xc;
      uVar17 = uVar17 + 1;
    } while ((int)uVar17 < pGVar12->nObjs);
  }
  pVVar10 = pGVar12->vCos;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar14];
      if (((long)iVar1 < 0) || (pGVar12->nObjs <= iVar1)) {
LAB_00651652:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar12->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = pGVar12->pObjs + iVar1;
      Dam_ManMultiAig_rec(pMan,p_00,pGVar12,pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff));
      if ((int)pGVar3[-(*(ulong *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_006516af:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,(uint)(*(ulong *)pGVar3 >> 0x1d) & 1 ^
                                   pGVar3[-(*(ulong *)pGVar3 & 0x1fffffff)].Value);
      pGVar3->Value = uVar6;
      lVar14 = lVar14 + 1;
      pVVar10 = pGVar12->vCos;
    } while (lVar14 < pVVar10->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,pGVar12->nRegs);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Dam_ManMultiAig( Dam_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->vLevels = Vec_IntStart( pNew->nObjsAlloc );
    // create constant and inputs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        Vec_IntWriteEntry( pNew->vLevels, Abc_Lit2Var(pObj->Value), Gia_ObjLevel(p, pObj) );
    }
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachBuf( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(p) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}